

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O0

istream * operator>>(istream *stream,BupHeader *header)

{
  ulong uVar1;
  istream *piVar2;
  bool bVar3;
  value_type_conflict4 vVar4;
  value_type_conflict3 vVar5;
  value_type_conflict3 vVar6;
  streamoff sVar7;
  ostream *this;
  size_type sVar8;
  reference pvVar9;
  char *pcVar10;
  undefined1 *in_RSI;
  istream *in_RDI;
  BupChunkV4 BVar11;
  undefined1 auVar12 [16];
  BupChunkV4 m;
  BupChunk *mouth;
  iterator __end4;
  iterator __begin4;
  vector<BupChunk,_std::allocator<BupChunk>_> *__range4;
  unsigned_long namelen;
  BupExpressionChunkV4 c_1;
  value_type *expChunk;
  size_t i;
  vector<char,_std::allocator<char>_> nameBuf;
  endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0> numExpChunks;
  endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0> t;
  BupChunkV4 c;
  BupChunk *chunk;
  iterator __end3;
  iterator __begin3;
  vector<BupChunk,_std::allocator<BupChunk>_> *__range3;
  endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0> numChunks;
  BupHeaderV4 h;
  int version;
  BupChunkV4 *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  uint32_le in_stack_fffffffffffffe34;
  uint32_le uVar13;
  undefined4 uVar14;
  undefined8 in_stack_fffffffffffffe38;
  undefined4 uVar15;
  string *in_stack_fffffffffffffe40;
  istream *in_stack_fffffffffffffe48;
  vector<BupChunk,_std::allocator<BupChunk>_> *in_stack_fffffffffffffe50;
  __normal_iterator<BupChunk_*,_std::vector<BupChunk,_std::allocator<BupChunk>_>_> local_140;
  vector<BupChunk,_std::allocator<BupChunk>_> *local_138;
  string local_130 [32];
  size_type local_110;
  reference local_d8;
  ulong local_d0;
  BupHeader *in_stack_ffffffffffffff38;
  istream *in_stack_ffffffffffffff40;
  undefined1 local_a8 [16];
  BupHeader *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  __normal_iterator<BupChunk_*,_std::vector<BupChunk,_std::allocator<BupChunk>_>_> local_68;
  undefined1 *local_60;
  uchar local_58 [4];
  int local_14;
  undefined1 *local_10;
  istream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_14 = detectSwitch(in_stack_fffffffffffffe48);
  if (local_14 < 0) {
    readBup<BupHeaderPS3>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  else if (local_14 < 4) {
    readBup<BupHeaderSwitch>
              ((istream *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
  }
  else {
    *local_10 = 1;
    readRaw<BupHeaderV4>
              ((istream *)CONCAT44(in_stack_fffffffffffffe34.value_,in_stack_fffffffffffffe30));
    vVar4 = boost::endian::
            endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
            value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                   *)0x116a44);
    *(value_type_conflict4 *)(local_10 + 4) = vVar4;
    vVar4 = boost::endian::
            endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
            value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                   *)0x116a64);
    *(value_type_conflict4 *)(local_10 + 2) = vVar4;
    vVar4 = boost::endian::
            endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
            value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                   *)0x116a84);
    *(value_type_conflict4 *)(local_10 + 6) = vVar4;
    vVar4 = boost::endian::
            endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>::
            value((endian_buffer<(boost::endian::order)1,_unsigned_short,_16UL,_(boost::endian::align)0>
                   *)0x116aa4);
    *(value_type_conflict4 *)(local_10 + 8) = vVar4;
    local_58 = (uchar  [4])
               readRaw<boost::endian::endian_buffer<(boost::endian::order)1,unsigned_int,32ul,(boost::endian::align)0>>
                         ((istream *)in_stack_fffffffffffffe28);
    boost::endian::
    endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>::value
              ((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
                *)0x116ae5);
    std::vector<BupChunk,_std::allocator<BupChunk>_>::resize
              (in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
    local_60 = local_10 + 0x10;
    local_68._M_current =
         (BupChunk *)
         std::vector<BupChunk,_std::allocator<BupChunk>_>::begin
                   ((vector<BupChunk,_std::allocator<BupChunk>_> *)in_stack_fffffffffffffe28);
    std::vector<BupChunk,_std::allocator<BupChunk>_>::end
              ((vector<BupChunk,_std::allocator<BupChunk>_> *)in_stack_fffffffffffffe28);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<BupChunk_*,_std::vector<BupChunk,_std::allocator<BupChunk>_>_>
                          *)CONCAT44(in_stack_fffffffffffffe34.value_,in_stack_fffffffffffffe30),
                         (__normal_iterator<BupChunk_*,_std::vector<BupChunk,_std::allocator<BupChunk>_>_>
                          *)in_stack_fffffffffffffe28);
      if (!bVar3) break;
      __gnu_cxx::__normal_iterator<BupChunk_*,_std::vector<BupChunk,_std::allocator<BupChunk>_>_>::
      operator*(&local_68);
      readRaw<BupChunkV4>((istream *)
                          CONCAT44(in_stack_fffffffffffffe34.value_,in_stack_fffffffffffffe30));
      copyTo<BupChunkV4>((BupChunk *)
                         CONCAT44(in_stack_fffffffffffffe34.value_,in_stack_fffffffffffffe30),
                         in_stack_fffffffffffffe28);
      __gnu_cxx::__normal_iterator<BupChunk_*,_std::vector<BupChunk,_std::allocator<BupChunk>_>_>::
      operator++(&local_68);
    }
    while( true ) {
      auVar12 = std::istream::tellg();
      local_a8 = auVar12;
      sVar7 = std::fpos::operator_cast_to_long((fpos *)local_a8);
      if (sVar7 % 0x10 == 0) break;
      readRaw<boost::endian::endian_buffer<(boost::endian::order)1,unsigned_int,32ul,(boost::endian::align)0>>
                ((istream *)in_stack_fffffffffffffe28);
      vVar5 = boost::endian::
              endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>::
              value((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
                     *)0x116c1f);
      if (vVar5 != 0) {
        this = std::operator<<((ostream *)&std::cerr,"Unexpected nonzero values in header");
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      }
    }
    readRaw<boost::endian::endian_buffer<(boost::endian::order)1,unsigned_int,32ul,(boost::endian::align)0>>
              ((istream *)in_stack_fffffffffffffe28);
    boost::endian::
    endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>::value
              ((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
                *)0x116c7d);
    std::vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>::resize
              ((vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_> *)
               in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)0x116c98);
    BVar11.unk.value_[0] = in_stack_fffffffffffffe34.value_[0];
    BVar11.unk.value_[1] = in_stack_fffffffffffffe34.value_[1];
    BVar11.unk.value_[2] = in_stack_fffffffffffffe34.value_[2];
    BVar11.unk.value_[3] = in_stack_fffffffffffffe34.value_[3];
    uVar14 = (undefined4)in_stack_fffffffffffffe38;
    uVar15 = (undefined4)((ulong)in_stack_fffffffffffffe38 >> 0x20);
    BVar11.offset.value_[0] = (char)uVar14;
    BVar11.offset.value_[1] = (char)((uint)uVar14 >> 8);
    BVar11.offset.value_[2] = (char)((uint)uVar14 >> 0x10);
    BVar11.offset.value_[3] = (char)((uint)uVar14 >> 0x18);
    BVar11.size.value_[0] = (char)uVar15;
    BVar11.size.value_[1] = (char)((uint)uVar15 >> 8);
    BVar11.size.value_[2] = (char)((uint)uVar15 >> 0x10);
    BVar11.size.value_[3] = (char)((uint)uVar15 >> 0x18);
    local_d0 = 0;
    while( true ) {
      uVar1 = local_d0;
      sVar8 = std::vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>::size
                        ((vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_> *)
                         (local_10 + 0x28));
      if (sVar8 <= uVar1) break;
      local_d8 = std::vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>::operator[]
                           ((vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_> *)
                            (local_10 + 0x28),local_d0);
      readRaw<BupExpressionChunkV4>
                ((istream *)CONCAT44(BVar11.unk.value_.value_,in_stack_fffffffffffffe30));
      copyTo<BupChunkV4>((BupChunk *)CONCAT44(BVar11.unk.value_.value_,in_stack_fffffffffffffe30),
                         in_stack_fffffffffffffe28);
      vVar5 = boost::endian::
              endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>::
              value((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
                     *)0x116d33);
      vVar6 = boost::endian::
              endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>::
              value((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
                     *)0x116d47);
      local_110 = ((ulong)vVar5 + (ulong)vVar6 * -0xc) - 0x20;
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe50,
                 (size_type)in_stack_fffffffffffffe48);
      pvVar9 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)&stack0xffffffffffffff38,local_110)
      ;
      piVar2 = local_8;
      *pvVar9 = '\0';
      pcVar10 = std::vector<char,_std::allocator<char>_>::data
                          ((vector<char,_std::allocator<char>_> *)0x116db5);
      std::istream::read((char *)piVar2,(long)pcVar10);
      in_stack_fffffffffffffe50 =
           (vector<BupChunk,_std::allocator<BupChunk>_> *)&stack0xffffffffffffff38;
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)0x116dde);
      pcVar10 = std::vector<char,_std::allocator<char>_>::data
                          ((vector<char,_std::allocator<char>_> *)0x116ded);
      strlen(pcVar10);
      toUTF8_abi_cxx11_(BVar11._0_8_,CONCAT44(BVar11.unk.value_.value_,in_stack_fffffffffffffe30));
      in_stack_fffffffffffffe40 = local_130;
      std::__cxx11::string::operator=((string *)local_d8,in_stack_fffffffffffffe40);
      std::__cxx11::string::~string(in_stack_fffffffffffffe40);
      in_stack_fffffffffffffe48 = (istream *)&local_d8->mouths;
      boost::endian::
      endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>::value
                ((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
                  *)0x116e4e);
      std::vector<BupChunk,_std::allocator<BupChunk>_>::resize
                (in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
      local_138 = &local_d8->mouths;
      local_140._M_current =
           (BupChunk *)
           std::vector<BupChunk,_std::allocator<BupChunk>_>::begin
                     ((vector<BupChunk,_std::allocator<BupChunk>_> *)in_stack_fffffffffffffe28);
      std::vector<BupChunk,_std::allocator<BupChunk>_>::end
                ((vector<BupChunk,_std::allocator<BupChunk>_> *)in_stack_fffffffffffffe28);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<BupChunk_*,_std::vector<BupChunk,_std::allocator<BupChunk>_>_>
                            *)CONCAT44(BVar11.unk.value_.value_,in_stack_fffffffffffffe30),
                           (__normal_iterator<BupChunk_*,_std::vector<BupChunk,_std::allocator<BupChunk>_>_>
                            *)in_stack_fffffffffffffe28);
        uVar13 = BVar11.unk.value_;
        if (!bVar3) break;
        __gnu_cxx::__normal_iterator<BupChunk_*,_std::vector<BupChunk,_std::allocator<BupChunk>_>_>
        ::operator*(&local_140);
        BVar11 = readRaw<BupChunkV4>((istream *)CONCAT44(uVar13.value_,in_stack_fffffffffffffe30));
        copyTo<BupChunkV4>((BupChunk *)CONCAT44(BVar11.unk.value_.value_,in_stack_fffffffffffffe30),
                           in_stack_fffffffffffffe28);
        __gnu_cxx::__normal_iterator<BupChunk_*,_std::vector<BupChunk,_std::allocator<BupChunk>_>_>
        ::operator++(&local_140);
      }
      local_d0 = local_d0 + 1;
    }
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffe40);
  }
  return local_8;
}

Assistant:

std::istream& operator>> (std::istream& stream, BupHeader &header) {
	int version = detectSwitch(stream);
	if (version < 0) { // PS3
		readBup<BupHeaderPS3>(stream, header);
	} else if (version < 4) { // Switch Old
		readBup<BupHeaderSwitch>(stream, header);
	} else { // Switch New
		header.isSwitch = true;
		auto h = readRaw<BupHeaderV4>(stream);
		header.eh = h.eh.value();
		header.ew = h.ew.value();
		header.width = h.width.value();
		header.height = h.height.value();
		auto numChunks = readRaw<uint32_le>(stream);
		header.chunks.resize(numChunks.value());

		for (auto& chunk : header.chunks) {
			auto c = readRaw<BupChunkV4>(stream);
			copyTo(chunk, c);
		}

		while (stream.tellg() % 16 != 0) {
			auto t = readRaw<uint32_le>(stream);
			if (t.value() != 0) {
				std::cerr << "Unexpected nonzero values in header" << std::endl;
			}
		}

		auto numExpChunks = readRaw<uint32_le>(stream);
		header.expChunks.resize(numExpChunks.value());
		std::vector<char> nameBuf;

		for (size_t i = 0; i < header.expChunks.size(); i++) {
			auto& expChunk = header.expChunks[i];
			auto c = readRaw<BupExpressionChunkV4>(stream);
			copyTo(expChunk.face, c.face);
			auto namelen = c.headerLen.value() - sizeof(c) - c.numMouths.value() * sizeof(BupChunkV4);
			nameBuf.resize(namelen + 1);
			nameBuf[namelen] = 0;
			stream.read(nameBuf.data(), namelen);
			expChunk.name = toUTF8(nameBuf.data(), strlen(nameBuf.data()));

			expChunk.mouths.resize(c.numMouths.value());
			for (auto& mouth : expChunk.mouths) {
				auto m = readRaw<BupChunkV4>(stream);
				copyTo(mouth, m);
			}
		}
	}
	return stream;
}